

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_IncorrectConstructionDuplicateRequiresTxt_Test::TestBody
          (TApp_IncorrectConstructionDuplicateRequiresTxt_Test *this)

{
  bool bVar1;
  Option *this_00;
  App *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertHelper local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"--cat",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_d8);
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_flag(this_01,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"--other",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_d8);
  CLI::App::add_flag(this_01,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_b0,"--other",(allocator *)&local_e0);
      CLI::Option::requires<CLI::App>(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_d0,"--other",(allocator *)&local_e0);
      CLI::Option::requires<CLI::App>(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    testing::Message::Message((Message *)&local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xbb,
               "Expected: cat->requires(\"--other\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
  }
  else {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xba,
               "Expected: cat->requires(\"--other\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_e0);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateRequiresTxt) {
    auto cat = app.add_flag("--cat");
    app.add_flag("--other");
    ASSERT_NO_THROW(cat->requires("--other"));
    EXPECT_THROW(cat->requires("--other"), CLI::OptionAlreadyAdded);
}